

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O1

bool __thiscall
google::protobuf::internal::ReflectionSchema::InRealOneof
          (ReflectionSchema *this,FieldDescriptor *field)

{
  OneofDescriptor *pOVar1;
  
  if ((field->field_0x3 & 1) != 0) {
    if ((field->field_0x1 & 0x10) == 0) {
      pOVar1 = (OneofDescriptor *)0x0;
    }
    else {
      pOVar1 = (field->scope_).containing_oneof;
      if (pOVar1 == (OneofDescriptor *)0x0) {
        protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
    }
    if (pOVar1 != (OneofDescriptor *)0x0) {
      if ((pOVar1->field_count_ != 1) || ((pOVar1->fields_->field_0x1 & 2) == 0)) goto LAB_001fd601;
      InRealOneof();
    }
    protobuf_assumption_failed
              ("res != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb63);
  }
LAB_001fd601:
  return (bool)(field->field_0x3 & 1);
}

Assistant:

bool InRealOneof(const FieldDescriptor* field) const {
    return field->real_containing_oneof();
  }